

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElement.cpp
# Opt level: O2

string * __thiscall
ninx::parser::element::TextElement::dump_abi_cxx11_
          (string *__return_storage_ptr__,TextElement *this,int level)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_58,(char)level);
  std::operator+(&local_38,&local_58,"TextElement: ");
  std::operator+(__return_storage_ptr__,&local_38,&this->text);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::TextElement::dump(int level) const {
    return std::string(level, '\t')+"TextElement: "+this->text;
}